

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDataflow_cpp.h
# Opt level: O0

u32 __thiscall
moira::Moira::readM<(moira::MemSpace)2,(moira::Size)2,0ul>(Moira *this,u32 addr,bool *error)

{
  AEStackFrame frame;
  undefined8 uVar1;
  bool bVar2;
  Moira *in_RDX;
  u32 in_ESI;
  Moira *in_RDI;
  AEStackFrame AVar3;
  u32 addr_00;
  Moira *in_stack_ffffffffffffffd0;
  u32 in_stack_ffffffffffffffdc;
  u32 local_4;
  
  bVar2 = misaligned<(moira::Size)2>(in_RDI,in_ESI);
  *(bool *)&in_RDX->_vptr_Moira = bVar2;
  addr_00 = (u32)((ulong)in_RDI >> 0x20);
  if (bVar2) {
    setFC(in_RDI,FC_USER_PROG);
    AVar3 = makeFrame<0ul>(in_RDX,in_stack_ffffffffffffffdc);
    uVar1 = AVar3._8_8_;
    frame._8_8_ = in_RDX;
    frame.code = (short)uVar1;
    frame._2_2_ = (short)((ulong)uVar1 >> 0x10);
    frame.addr = (int)((ulong)uVar1 >> 0x20);
    execAddressError(AVar3._0_8_,frame,addr_00);
    local_4 = 0;
  }
  else {
    local_4 = readM<(moira::MemSpace)2,(moira::Size)2,0ul>(in_stack_ffffffffffffffd0,addr_00);
  }
  return local_4;
}

Assistant:

u32
Moira::readM(u32 addr, bool &error)
{
    // Check for address errors
    if ((error = misaligned<S>(addr))) {
        setFC(M == MEM_DATA ? FC_USER_DATA : FC_USER_PROG);
        execAddressError(makeFrame<F>(addr), 2);
        return 0;
    }
    
    return readM<M,S,F>(addr);
}